

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineLimitTests.cpp
# Opt level: O3

void __thiscall
agge::tests::LimitEllipsisTests::TrimPositionIsResetOnNewLine(LimitEllipsisTests *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  FailedAssertion *pFVar4;
  float fVar5;
  char *i;
  layout_builder b;
  char *local_110;
  string local_108;
  ellipsis local_e4;
  string local_c0;
  LocationInfo local_a0;
  layout_builder local_78;
  
  local_78.ellipsis_codepoint = 0x2026;
  local_78.ellipsis_symbol.first = 0x8b;
  local_78.ellipsis_symbol.second = 3.71;
  local_78.trimmed_at.
  super__Vector_base<agge::layout_builder::state,_std::allocator<agge::layout_builder::state>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.trimmed_at.
  super__Vector_base<agge::layout_builder::state,_std::allocator<agge::layout_builder::state>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.trimmed_at.
  super__Vector_base<agge::layout_builder::state,_std::allocator<agge::layout_builder::state>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.appended.
  super__Vector_base<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>,_std::allocator<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.appended.
  super__Vector_base<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>,_std::allocator<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.appended.
  super__Vector_base<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>,_std::allocator<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.state.extent = 0.0;
  local_78.state.next = 0;
  local_110 = "foobar";
  local_e4._limit = 50.0;
  local_e4._symbol_codepoint = 0x2026;
  local_e4._at.extent = 0.0;
  local_e4._at.next = 0;
  local_e4._at_symbol.first = 0;
  local_e4._at_symbol.second = 0.0;
  local_e4._stop = false;
  local_e4._symbol = mocks::layout_builder::current_glyph(&local_78,0x2026);
  fVar5 = local_e4._symbol.second + 46.0;
  local_78.state.extent = 46.0;
  local_78.state.next = 10;
  if ((fVar5 <= 50.0) && (50.0 < fVar5 + 5.0)) {
    local_e4._at.extent = 46.0;
    local_e4._at.next = 10;
    local_e4._at_symbol = local_e4._symbol;
  }
  bVar3 = layout_builder::state::operator!(&local_e4._at);
  if (!bVar3) {
    limit::ellipsis::trim<agge::tests::mocks::layout_builder,char_const*>
              (&local_e4,&local_78,&local_110,"oobar");
  }
  if (local_78.appended.
      super__Vector_base<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>,_std::allocator<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_78.appended.
      super__Vector_base<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>,_std::allocator<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_78.appended.
    super__Vector_base<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>,_std::allocator<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_78.appended.
         super__Vector_base<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>,_std::allocator<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  if (local_78.trimmed_at.
      super__Vector_base<agge::layout_builder::state,_std::allocator<agge::layout_builder::state>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_78.trimmed_at.
      super__Vector_base<agge::layout_builder::state,_std::allocator<agge::layout_builder::state>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_78.trimmed_at.
    super__Vector_base<agge::layout_builder::state,_std::allocator<agge::layout_builder::state>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_78.trimmed_at.
         super__Vector_base<agge::layout_builder::state,_std::allocator<agge::layout_builder::state>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  local_e4._at.extent = 0.0;
  local_e4._at.next = 0;
  local_e4._stop = false;
  local_78.state.extent = 46.3;
  if ((local_e4._symbol.second + 46.3 <= local_e4._limit) &&
     (local_e4._limit < local_e4._symbol.second + 46.3 + 4.1)) {
    local_e4._at = local_78.state;
    local_e4._at_symbol = local_e4._symbol;
  }
  if (local_e4._limit <= 50.399998) {
    bVar3 = layout_builder::state::operator!(&local_e4._at);
    if (bVar3) {
      bVar3 = false;
    }
    else {
      bVar3 = limit::ellipsis::trim<agge::tests::mocks::layout_builder,char_const*>
                        (&local_e4,&local_78,&local_110,"bar");
    }
  }
  else {
    mocks::layout_builder::append_glyph(&local_78,0x19,4.1);
    local_110 = "bar";
    bVar3 = true;
  }
  paVar1 = &local_108.field_2;
  local_108._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_108,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LineLimitTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_a0,&local_108,0x181);
  if (bVar3 != false) {
    pFVar4 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,"Value is not \'false\'!","");
    ut::FailedAssertion::FailedAssertion(pFVar4,&local_c0,&local_a0);
    __cxa_throw(pFVar4,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  paVar2 = &local_a0.filename.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_a0.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  local_108._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_108,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LineLimitTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_a0,&local_108,0x184);
  if (local_78.appended.
      super__Vector_base<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>,_std::allocator<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_78.appended.
      super__Vector_base<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>,_std::allocator<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pFVar4 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,"The container is not empty!","");
    ut::FailedAssertion::FailedAssertion(pFVar4,&local_c0,&local_a0);
    __cxa_throw(pFVar4,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_a0.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  local_108._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_108,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LineLimitTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_a0,&local_108,0x185);
  if (local_78.trimmed_at.
      super__Vector_base<agge::layout_builder::state,_std::allocator<agge::layout_builder::state>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_78.trimmed_at.
      super__Vector_base<agge::layout_builder::state,_std::allocator<agge::layout_builder::state>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pFVar4 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,"The container is not empty!","");
    ut::FailedAssertion::FailedAssertion(pFVar4,&local_c0,&local_a0);
    __cxa_throw(pFVar4,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_a0.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  local_108._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_108,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LineLimitTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_a0,&local_108,0x186);
  if (local_110 != "oobar") {
    pFVar4 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Values are not equal!","");
    ut::FailedAssertion::FailedAssertion(pFVar4,&local_c0,&local_a0);
    __cxa_throw(pFVar4,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_a0.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  if (local_78.appended.
      super__Vector_base<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>,_std::allocator<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.appended.
                    super__Vector_base<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>,_std::allocator<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.trimmed_at.
      super__Vector_base<agge::layout_builder::state,_std::allocator<agge::layout_builder::state>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.trimmed_at.
                    super__Vector_base<agge::layout_builder::state,_std::allocator<agge::layout_builder::state>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

test( TrimPositionIsResetOnNewLine )
			{
				// INIT
				mocks::layout_builder b;
				const char *const begin = "foobar", *const end = begin + 6;
				const char *i = begin;
				limit::ellipsis e(50.0f);

				e.begin_style(b);
				b.state.extent = 50.0f - 4.0f;
				b.state.next = 10;

				e.add_glyph(b, 25, 5.0f, i, begin + 1, end);
				b.appended.clear();
				b.trimmed_at.clear();

				// ACT
				e.new_line();
				b.state.extent = 50.0f - 3.7f; // not enough space for the ellipsis
				assert_is_false(e.add_glyph(b, 25, 4.1f, i, begin + 3, end));

				// ASSERT
				assert_is_empty(b.appended);
				assert_is_empty(b.trimmed_at);
				assert_equal(begin + 1, i);
			}